

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::ClampScrollOffset(Element *this)

{
  Vector2<float> rhs;
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector2f local_18;
  Vector2f new_scroll_offset;
  Element *this_local;
  
  fVar4 = (this->scroll_offset).x;
  new_scroll_offset = (Vector2f)this;
  fVar2 = GetScrollWidth(this);
  fVar3 = GetClientWidth(this);
  fVar4 = Math::Min<float>(fVar4,fVar2 - fVar3);
  fVar2 = Math::Round(fVar4);
  fVar4 = (this->scroll_offset).y;
  fVar3 = GetScrollHeight(this);
  fVar5 = GetClientHeight(this);
  fVar4 = Math::Min<float>(fVar4,fVar3 - fVar5);
  fVar4 = Math::Round(fVar4);
  Vector2<float>::Vector2(&local_18,fVar2,fVar4);
  rhs.x = (this->scroll_offset).x;
  rhs.y = (this->scroll_offset).y;
  bVar1 = Vector2<float>::operator!=(&local_18,rhs);
  if (bVar1) {
    this->scroll_offset = local_18;
    DirtyAbsoluteOffset(this);
  }
  ElementScroll::UpdateProperties(&this->meta->scroll);
  return;
}

Assistant:

void Element::ClampScrollOffset()
{
	const Vector2f new_scroll_offset = {
		Math::Round(Math::Min(scroll_offset.x, GetScrollWidth() - GetClientWidth())),
		Math::Round(Math::Min(scroll_offset.y, GetScrollHeight() - GetClientHeight())),
	};

	if (new_scroll_offset != scroll_offset)
	{
		scroll_offset = new_scroll_offset;
		DirtyAbsoluteOffset();
	}

	// At this point the scrollbars have been resolved, both in terms of size and visibility. Update their properties
	// now so that any visibility changes in particular are reflected immediately on the next render. Otherwise we risk
	// that the scrollbars renders a frame late, since changes to scrollbars can happen during layouting.
	meta->scroll.UpdateProperties();
}